

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O0

void __thiscall FIX::HttpServer::stop(HttpServer *this)

{
  HttpServer *this_local;
  
  if ((this->m_stop & 1U) == 0) {
    this->m_stop = true;
    onStop(this);
    if (this->m_threadid != 0) {
      thread_join(this->m_threadid);
    }
    this->m_threadid = 0;
  }
  return;
}

Assistant:

void HttpServer::stop() {
  if (m_stop) {
    return;
  }
  m_stop = true;
  onStop();

  if (m_threadid) {
    thread_join(m_threadid);
  }
  m_threadid = 0;
}